

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O1

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo<std::__cxx11::string>
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          InternalMetadata *metadata,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  pair<const_char_*,_unsigned_long> pVar7;
  anon_class_40_5_beb31822 add;
  bool bVar8;
  uint uVar9;
  LogMessage *other;
  string *s;
  MessageLite *pMVar10;
  void *pvVar11;
  char *pcVar12;
  ulong uVar13;
  undefined7 in_register_00000011;
  FieldType FVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  uint32_t uVar15;
  FieldDescriptor *pFVar16;
  int value;
  uint64_t val;
  pair<const_char_*,_int> pVar17;
  pair<const_char_*,_unsigned_long> pVar18;
  pair<const_char_*,_unsigned_long> pVar19;
  pair<const_char_*,_unsigned_long> pVar20;
  pair<const_char_*,_unsigned_long> pVar21;
  pair<const_char_*,_unsigned_long> pVar22;
  pair<const_char_*,_unsigned_long> pVar23;
  LogFinisher local_69;
  void *local_68;
  EnumValidityFuncWithArg *pEStack_60;
  void *pvStack_58;
  _Alloc_hider _Stack_50;
  int local_48;
  undefined4 uStack_44;
  
  bVar1 = extension->type;
  if ((int)CONCAT71(in_register_00000011,was_packed_on_wire) != 0) {
    switch(bVar1) {
    case 1:
      pvVar11 = MutableRawRepeatedField
                          (this,number,bVar1,extension->is_packed,extension->descriptor);
      pcVar12 = PackedDoubleParser(pvVar11,ptr,ctx);
      return pcVar12;
    case 2:
      pvVar11 = MutableRawRepeatedField
                          (this,number,bVar1,extension->is_packed,extension->descriptor);
      pcVar12 = PackedFloatParser(pvVar11,ptr,ctx);
      return pcVar12;
    case 3:
      pvVar11 = MutableRawRepeatedField
                          (this,number,bVar1,extension->is_packed,extension->descriptor);
      pcVar12 = PackedInt64Parser(pvVar11,ptr,ctx);
      return pcVar12;
    case 4:
      pvVar11 = MutableRawRepeatedField
                          (this,number,bVar1,extension->is_packed,extension->descriptor);
      pcVar12 = PackedUInt64Parser(pvVar11,ptr,ctx);
      return pcVar12;
    case 5:
      pvVar11 = MutableRawRepeatedField
                          (this,number,bVar1,extension->is_packed,extension->descriptor);
      pcVar12 = PackedInt32Parser(pvVar11,ptr,ctx);
      return pcVar12;
    case 6:
      pvVar11 = MutableRawRepeatedField
                          (this,number,bVar1,extension->is_packed,extension->descriptor);
      pcVar12 = PackedFixed64Parser(pvVar11,ptr,ctx);
      return pcVar12;
    case 7:
      pvVar11 = MutableRawRepeatedField
                          (this,number,bVar1,extension->is_packed,extension->descriptor);
      pcVar12 = PackedFixed32Parser(pvVar11,ptr,ctx);
      return pcVar12;
    case 8:
      pvVar11 = MutableRawRepeatedField
                          (this,number,bVar1,extension->is_packed,extension->descriptor);
      pcVar12 = PackedBoolParser(pvVar11,ptr,ctx);
      return pcVar12;
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      LogMessage::LogMessage
                ((LogMessage *)&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_inl.h"
                 ,0x4f);
      other = LogMessage::operator<<
                        ((LogMessage *)&local_68,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_69,other);
      LogMessage::~LogMessage((LogMessage *)&local_68);
      return ptr;
    case 0xd:
      pvVar11 = MutableRawRepeatedField
                          (this,number,bVar1,extension->is_packed,extension->descriptor);
      pcVar12 = PackedUInt32Parser(pvVar11,ptr,ctx);
      return pcVar12;
    case 0xe:
      local_68 = MutableRawRepeatedField
                           (this,number,bVar1,extension->is_packed,extension->descriptor);
      pEStack_60 = (extension->field_5).enum_validity_check.func;
      pvStack_58 = (extension->field_5).enum_validity_check.arg;
      add._36_4_ = uStack_44;
      add.field_num = number;
      add.is_valid = pEStack_60;
      add.object = local_68;
      add.data = pvStack_58;
      add.metadata = metadata;
      _Stack_50._M_p = (pointer)metadata;
      local_48 = number;
      pcVar12 = EpsCopyInputStream::
                ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(unsigned_long)_1_>
                          (&ctx->super_EpsCopyInputStream,ptr,add);
      return pcVar12;
    case 0xf:
      pvVar11 = MutableRawRepeatedField
                          (this,number,bVar1,extension->is_packed,extension->descriptor);
      pcVar12 = PackedSFixed32Parser(pvVar11,ptr,ctx);
      return pcVar12;
    case 0x10:
      pvVar11 = MutableRawRepeatedField
                          (this,number,bVar1,extension->is_packed,extension->descriptor);
      pcVar12 = PackedSFixed64Parser(pvVar11,ptr,ctx);
      return pcVar12;
    case 0x11:
      pvVar11 = MutableRawRepeatedField
                          (this,number,bVar1,extension->is_packed,extension->descriptor);
      pcVar12 = PackedSInt32Parser(pvVar11,ptr,ctx);
      return pcVar12;
    case 0x12:
      pvVar11 = MutableRawRepeatedField
                          (this,number,bVar1,extension->is_packed,extension->descriptor);
      pcVar12 = PackedSInt64Parser(pvVar11,ptr,ctx);
      return pcVar12;
    default:
      return ptr;
    }
  }
  switch(bVar1 - 1) {
  case 0:
    if (extension->is_repeated == true) {
      AddDouble(this,number,'\x01',extension->is_packed,*(double *)ptr,extension->descriptor);
      return ptr + 8;
    }
    SetDouble(this,number,'\x01',*(double *)ptr,extension->descriptor);
    return ptr + 8;
  case 1:
    if (extension->is_repeated == true) {
      AddFloat(this,number,'\x02',extension->is_packed,*(float *)ptr,extension->descriptor);
      return ptr + 4;
    }
    SetFloat(this,number,'\x02',*(float *)ptr,extension->descriptor);
    return ptr + 4;
  case 2:
    bVar1 = *ptr;
    pVar19.second = (long)(char)bVar1;
    pVar19.first = ptr + 1;
    if ((long)(char)bVar1 < 0) {
      bVar2 = ptr[1];
      uVar15 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar19 = VarintParseSlow64(ptr,uVar15);
      }
      else {
        pVar19.second._0_4_ = uVar15;
        pVar19.first = ptr + 2;
        pVar19.second._4_4_ = 0;
      }
    }
    if (pVar19.first != (char *)0x0) {
      if (extension->is_repeated == true) {
        bVar8 = extension->is_packed;
        pFVar16 = extension->descriptor;
        FVar14 = '\x03';
        goto LAB_003b34ab;
      }
      pFVar16 = extension->descriptor;
      FVar14 = '\x03';
LAB_003b34c8:
      pcVar12 = pVar19.first;
      SetInt64(this,number,FVar14,pVar19.second,pFVar16);
LAB_003b3557:
      if (pcVar12 != (char *)0x0) {
        return pcVar12;
      }
    }
    break;
  case 3:
    bVar1 = *ptr;
    pVar20.second = (long)(char)bVar1;
    pVar20.first = ptr + 1;
    if ((long)(char)bVar1 < 0) {
      bVar2 = ptr[1];
      uVar15 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar20 = VarintParseSlow64(ptr,uVar15);
      }
      else {
        pVar20.second._0_4_ = uVar15;
        pVar20.first = ptr + 2;
        pVar20.second._4_4_ = 0;
      }
    }
    pcVar12 = pVar20.first;
    if (pcVar12 != (char *)0x0) {
      if (extension->is_repeated == true) {
        AddUInt64(this,number,'\x04',extension->is_packed,pVar20.second,extension->descriptor);
      }
      else {
        SetUInt64(this,number,'\x04',pVar20.second,extension->descriptor);
      }
      goto LAB_003b3557;
    }
    break;
  case 4:
    bVar1 = *ptr;
    auVar4._8_8_ = (long)(char)bVar1;
    auVar4._0_8_ = ptr + 1;
    auVar6 = auVar4._0_12_;
    if ((long)(char)bVar1 < 0) {
      bVar2 = ptr[1];
      uVar15 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar22 = VarintParseSlow64(ptr,uVar15);
        auVar6 = pVar22._0_12_;
      }
      else {
        auVar6._8_4_ = uVar15;
        auVar6._0_8_ = ptr + 2;
      }
    }
    pcVar12 = auVar6._0_8_;
    uVar9 = auVar6._8_4_;
    if (pcVar12 != (char *)0x0) {
      if (extension->is_repeated == true) {
        bVar8 = extension->is_packed;
        pFVar16 = extension->descriptor;
        FVar14 = '\x05';
        goto LAB_003b3383;
      }
      pFVar16 = extension->descriptor;
      FVar14 = '\x05';
LAB_003b33a0:
      SetInt32(this,number,FVar14,uVar9,pFVar16);
      goto LAB_003b3557;
    }
    break;
  case 5:
    if (extension->is_repeated == true) {
      AddUInt64(this,number,'\x06',extension->is_packed,*(uint64_t *)ptr,extension->descriptor);
      return ptr + 8;
    }
    SetUInt64(this,number,'\x06',*(uint64_t *)ptr,extension->descriptor);
    return ptr + 8;
  case 6:
    if (extension->is_repeated == true) {
      AddUInt32(this,number,'\a',extension->is_packed,*(uint32_t *)ptr,extension->descriptor);
      return ptr + 4;
    }
    SetUInt32(this,number,'\a',*(uint32_t *)ptr,extension->descriptor);
    return ptr + 4;
  case 7:
    bVar1 = *ptr;
    pVar21.second = (long)(char)bVar1;
    pVar21.first = ptr + 1;
    if ((long)(char)bVar1 < 0) {
      bVar2 = ptr[1];
      uVar15 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar21 = VarintParseSlow64(ptr,uVar15);
      }
      else {
        pVar21.second._0_4_ = uVar15;
        pVar21.first = ptr + 2;
        pVar21.second._4_4_ = 0;
      }
    }
    pcVar12 = pVar21.first;
    if (pcVar12 != (char *)0x0) {
      if (extension->is_repeated == true) {
        AddBool(this,number,'\b',extension->is_packed,pVar21.second != 0,extension->descriptor);
      }
      else {
        SetBool(this,number,'\b',pVar21.second != 0,extension->descriptor);
      }
      goto LAB_003b3557;
    }
    break;
  case 8:
  case 0xb:
    if (extension->is_repeated == true) {
      s = AddString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    else {
      s = MutableString_abi_cxx11_(this,number,'\t',extension->descriptor);
    }
    bVar1 = *ptr;
    uVar9 = (uint)bVar1;
    if ((char)bVar1 < '\0') {
      pVar17 = ReadSizeFallback(ptr,(uint)bVar1);
      uVar9 = pVar17.second;
      pcVar12 = pVar17.first;
    }
    else {
      pcVar12 = ptr + 1;
    }
    if (pcVar12 != (char *)0x0) {
      pcVar12 = EpsCopyInputStream::ReadString(&ctx->super_EpsCopyInputStream,pcVar12,uVar9,s);
      return pcVar12;
    }
    break;
  case 9:
    pMVar10 = (MessageLite *)(extension->field_5).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar10 = AddMessage(this,number,'\n',pMVar10,extension->descriptor);
    }
    else {
      pMVar10 = MutableMessage(this,number,'\n',pMVar10,extension->descriptor);
    }
    pcVar12 = ParseContext::ParseGroup<google::protobuf::MessageLite>
                        (ctx,pMVar10,ptr,number * 8 + 3);
    return pcVar12;
  case 10:
    pMVar10 = (MessageLite *)(extension->field_5).enum_validity_check.func;
    if (extension->is_repeated == true) {
      pMVar10 = AddMessage(this,number,'\v',pMVar10,extension->descriptor);
    }
    else {
      pMVar10 = MutableMessage(this,number,'\v',pMVar10,extension->descriptor);
    }
    pcVar12 = ParseContext::ParseMessage(ctx,pMVar10,ptr);
    return pcVar12;
  case 0xc:
    bVar1 = *ptr;
    auVar3._8_8_ = (long)(char)bVar1;
    auVar3._0_8_ = ptr + 1;
    auVar5 = auVar3._0_12_;
    if ((long)(char)bVar1 < 0) {
      bVar2 = ptr[1];
      uVar15 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar22 = VarintParseSlow64(ptr,uVar15);
        auVar5 = pVar22._0_12_;
      }
      else {
        auVar5._8_4_ = uVar15;
        auVar5._0_8_ = ptr + 2;
      }
    }
    pcVar12 = auVar5._0_8_;
    if (pcVar12 != (char *)0x0) {
      if (extension->is_repeated == true) {
        AddUInt32(this,number,'\r',extension->is_packed,auVar5._8_4_,extension->descriptor);
      }
      else {
        SetUInt32(this,number,'\r',auVar5._8_4_,extension->descriptor);
      }
      goto LAB_003b3557;
    }
    break;
  case 0xd:
    val = (uint64_t)*ptr;
    pVar23.second._0_4_ = bVar1 - 1;
    pVar23.first = ptr + 1;
    pVar23.second._4_4_ = 0;
    if ((long)val < 0) {
      bVar1 = ptr[1];
      uVar9 = ((uint)(byte)*ptr + (uint)bVar1 * 0x80) - 0x80;
      if ((char)bVar1 < '\0') {
        pVar23 = VarintParseSlow64(ptr,uVar9);
        val = pVar23.second;
      }
      else {
        val = (uint64_t)uVar9;
        pVar23.second = (ulong)bVar1 << 7;
        pVar23.first = ptr + 2;
      }
    }
    pcVar12 = pVar23.first;
    if (pcVar12 != (char *)0x0) {
      value = (int)val;
      bVar8 = (*(extension->field_5).enum_validity_check.func)
                        ((extension->field_5).enum_validity_check.arg,value);
      if (bVar8) {
        if (extension->is_repeated == true) {
          AddEnum(this,number,'\x0e',extension->is_packed,value,extension->descriptor);
        }
        else {
          SetEnum(this,number,'\x0e',value,extension->descriptor);
        }
      }
      else {
        if ((metadata->ptr_ & 1U) == 0) {
          s_00 = InternalMetadata::mutable_unknown_fields_slow<std::__cxx11::string>(metadata);
        }
        else {
          s_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((metadata->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        WriteVarint(number,val,s_00);
      }
      goto LAB_003b3557;
    }
    break;
  case 0xe:
    if (extension->is_repeated == true) {
      AddInt32(this,number,'\x0f',extension->is_packed,*(int32_t *)ptr,extension->descriptor);
      return ptr + 4;
    }
    SetInt32(this,number,'\x0f',*(int32_t *)ptr,extension->descriptor);
    return ptr + 4;
  case 0xf:
    if (extension->is_repeated == true) {
      AddInt64(this,number,'\x10',extension->is_packed,*(int64_t *)ptr,extension->descriptor);
      return ptr + 8;
    }
    SetInt64(this,number,'\x10',*(int64_t *)ptr,extension->descriptor);
    return ptr + 8;
  case 0x10:
    bVar1 = *ptr;
    pVar18.second = (long)(char)bVar1;
    pVar18.first = ptr + 1;
    if ((long)(char)bVar1 < 0) {
      bVar2 = ptr[1];
      uVar15 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar18 = VarintParseSlow64(ptr,uVar15);
      }
      else {
        pVar18.second._0_4_ = uVar15;
        pVar18.first = ptr + 2;
        pVar18.second._4_4_ = 0;
      }
    }
    pcVar12 = pVar18.first;
    if (pcVar12 != (char *)0x0) {
      uVar9 = -((uint)pVar18.second & 1) ^ (uint)(pVar18.second >> 1) & 0x7fffffff;
      if (extension->is_repeated != true) {
        pFVar16 = extension->descriptor;
        FVar14 = '\x11';
        goto LAB_003b33a0;
      }
      bVar8 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar14 = '\x11';
LAB_003b3383:
      AddInt32(this,number,FVar14,bVar8,uVar9,pFVar16);
      goto LAB_003b3557;
    }
    break;
  case 0x11:
    bVar1 = *ptr;
    pVar22.second = (long)(char)bVar1;
    pVar22.first = ptr + 1;
    if ((long)(char)bVar1 < 0) {
      bVar2 = ptr[1];
      uVar15 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar22 = VarintParseSlow64(ptr,uVar15);
      }
      else {
        pVar22.second._0_4_ = uVar15;
        pVar22.first = ptr + 2;
        pVar22.second._4_4_ = 0;
      }
    }
    pcVar12 = pVar22.first;
    if (pcVar12 != (char *)0x0) {
      uVar13 = -(ulong)((uint)pVar22.second & 1) ^ pVar22.second >> 1;
      pVar7.second = uVar13;
      pVar7.first = pcVar12;
      pVar19.second = uVar13;
      pVar19.first = pcVar12;
      if (extension->is_repeated != true) {
        pFVar16 = extension->descriptor;
        FVar14 = '\x12';
        goto LAB_003b34c8;
      }
      bVar8 = extension->is_packed;
      pFVar16 = extension->descriptor;
      FVar14 = '\x12';
      pVar19 = pVar7;
LAB_003b34ab:
      pcVar12 = pVar19.first;
      AddInt64(this,number,FVar14,bVar8,pVar19.second,pFVar16);
      goto LAB_003b3557;
    }
    break;
  default:
    goto switchD_003b29ef_default;
  }
  ptr = (char *)0x0;
switchD_003b29ef_default:
  return ptr;
}

Assistant:

const char* ExtensionSet::ParseFieldWithExtensionInfo(
    int number, bool was_packed_on_wire, const ExtensionInfo& extension,
    InternalMetadata* metadata, const char* ptr, internal::ParseContext* ctx) {
  if (was_packed_on_wire) {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE)                                \
  case WireFormatLite::TYPE_##UPPERCASE:                                     \
    return internal::Packed##CPP_CAMELCASE##Parser(                          \
        MutableRawRepeatedField(number, extension.type, extension.is_packed, \
                                extension.descriptor),                       \
        ptr, ctx);
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT32, UInt32);
      HANDLE_TYPE(UINT64, UInt64);
      HANDLE_TYPE(SINT32, SInt32);
      HANDLE_TYPE(SINT64, SInt64);
      HANDLE_TYPE(FIXED32, Fixed32);
      HANDLE_TYPE(FIXED64, Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(FLOAT, Float);
      HANDLE_TYPE(DOUBLE, Double);
      HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        return internal::PackedEnumParserArg<T>(
            MutableRawRepeatedField(number, extension.type, extension.is_packed,
                                    extension.descriptor),
            ptr, ctx, extension.enum_validity_check.func,
            extension.enum_validity_check.arg, metadata, number);
      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }
  } else {
    switch (extension.type) {
#define HANDLE_VARINT_TYPE(UPPERCASE, CPP_CAMELCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64_t value;                                                         \
    ptr = VarintParse(ptr, &value);                                         \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_VARINT_TYPE(INT32, Int32);
      HANDLE_VARINT_TYPE(INT64, Int64);
      HANDLE_VARINT_TYPE(UINT32, UInt32);
      HANDLE_VARINT_TYPE(UINT64, UInt64);
      HANDLE_VARINT_TYPE(BOOL, Bool);
#undef HANDLE_VARINT_TYPE
#define HANDLE_SVARINT_TYPE(UPPERCASE, CPP_CAMELCASE, SIZE)                 \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64_t val;                                                           \
    ptr = VarintParse(ptr, &val);                                           \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    auto value = WireFormatLite::ZigZagDecode##SIZE(val);                   \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_SVARINT_TYPE(SINT32, Int32, 32);
      HANDLE_SVARINT_TYPE(SINT64, Int64, 64);
#undef HANDLE_SVARINT_TYPE
#define HANDLE_FIXED_TYPE(UPPERCASE, CPP_CAMELCASE, CPPTYPE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    auto value = UnalignedLoad<CPPTYPE>(ptr);                               \
    ptr += sizeof(CPPTYPE);                                                 \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_FIXED_TYPE(FIXED32, UInt32, uint32_t);
      HANDLE_FIXED_TYPE(FIXED64, UInt64, uint64_t);
      HANDLE_FIXED_TYPE(SFIXED32, Int32, int32_t);
      HANDLE_FIXED_TYPE(SFIXED64, Int64, int64_t);
      HANDLE_FIXED_TYPE(FLOAT, Float, float);
      HANDLE_FIXED_TYPE(DOUBLE, Double, double);
#undef HANDLE_FIXED_TYPE

      case WireFormatLite::TYPE_ENUM: {
        uint64_t val;
        ptr = VarintParse(ptr, &val);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        int value = val;

        if (!extension.enum_validity_check.func(
                extension.enum_validity_check.arg, value)) {
          WriteVarint(number, val, metadata->mutable_unknown_fields<T>());
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        int size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        return ctx->ReadString(ptr, size, value);
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        uint32_t tag = (number << 3) + WireFormatLite::WIRETYPE_START_GROUP;
        return ctx->ParseGroup(value, ptr, tag);
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        return ctx->ParseMessage(value, ptr);
      }
    }
  }
  return ptr;
}